

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O1

void __thiscall
CaDiCaL::LratChecker::add_derived_clause
          (LratChecker *this,uint64_t id,bool param_2,vector<int,_std::allocator<int>_> *c,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *proof_chain)

{
  int64_t *piVar1;
  Internal *pIVar2;
  pointer piVar3;
  bool bVar4;
  bool bVar5;
  LratCheckerClause **ppLVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  double s;
  double s_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  pIVar2 = this->internal;
  if ((pIVar2->profiles).checking.level <= (pIVar2->opts).profile) {
    Internal::time(pIVar2,(time_t *)id);
    Internal::start_profiling(pIVar2,&(pIVar2->profiles).checking,s);
  }
  (this->stats).added = (this->stats).added + 1;
  piVar1 = &(this->stats).derived;
  *piVar1 = *piVar1 + 1;
  import_clause(this,c);
  this->last_id = id;
  this->current_id = id;
  if ((this->size_clauses != 0) && (ppLVar6 = find(this,id), *ppLVar6 != (LratCheckerClause *)0x0))
  {
    add_derived_clause((LratChecker *)id);
  }
  this_00 = &local_60;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(this_00,proof_chain);
  bVar4 = check(this,this_00);
  bVar5 = true;
  if (bVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,proof_chain);
    this_00 = &local_48;
    bVar5 = check_resolution(this,this_00);
    bVar5 = !bVar5;
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                ((long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,(ulong)this_00);
    }
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
              ((long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,(ulong)this_00);
  }
  if (bVar5) {
    add_derived_clause(this);
  }
  else {
    insert(this);
  }
  piVar3 = (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (this->imported_clause).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar3;
  }
  pIVar2 = this->internal;
  if ((pIVar2->profiles).checking.level <= (pIVar2->opts).profile) {
    Internal::time(pIVar2,(time_t *)this_00);
    Internal::stop_profiling(pIVar2,&(pIVar2->profiles).checking,s_00);
  }
  return;
}

Assistant:

void LratChecker::add_derived_clause (uint64_t id, bool,
                                      const vector<int> &c,
                                      const vector<uint64_t> &proof_chain) {
  START (checking);
  LOG (c, "LRAT CHECKER addition of derived clause[%" PRIu64 "]", id);
  stats.added++;
  stats.derived++;
  import_clause (c);
  last_id = id;
  assert (id == current_id + 1);
  current_id = id;
  if (size_clauses) {
    LratCheckerClause **p = find (id), *d = *p;
    if (d) {
      fatal_message_start ();
      fputs ("different clause with id ", stderr);
      fprintf (stderr, "%" PRId64, id);
      fputs (" already present\n", stderr);
      fatal_message_end ();
    }
  }
  assert (id);
  if (!check (proof_chain) || !check_resolution (proof_chain)) {
    fatal_message_start ();
    fputs ("failed to check derived clause:\n", stderr);
    for (const auto &lit : imported_clause)
      fprintf (stderr, "%d ", lit);
    fputc ('0', stderr);
    fatal_message_end ();
  } else
    insert ();
  imported_clause.clear ();
  STOP (checking);
}